

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

size_t RVO::linearProgram3(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,float radius,
                          Vector3 *optVelocity,bool directionOpt,Vector3 *result)

{
  undefined8 uVar1;
  pointer pPVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ulong planeNo;
  long lVar5;
  float fVar6;
  undefined8 local_40;
  float local_38;
  
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    fVar6 = absSq(optVelocity);
    if (fVar6 <= radius * radius) {
      result->val_[2] = optVelocity->val_[2];
      *(undefined8 *)result->val_ = *(undefined8 *)optVelocity->val_;
      goto LAB_00106ebb;
    }
    normalize((RVO *)&local_40,optVelocity);
  }
  else {
    local_38 = optVelocity->val_[2];
    local_40 = *(undefined8 *)optVelocity->val_;
  }
  *(ulong *)result->val_ =
       CONCAT44(radius * (float)((ulong)local_40 >> 0x20),radius * (float)local_40);
  result->val_[2] = local_38 * radius;
LAB_00106ebb:
  lVar5 = 0x14;
  planeNo = 0;
  while( true ) {
    pPVar2 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pPVar2) / 0x18;
    if (uVar4 <= planeNo) {
      return uVar4;
    }
    uVar1 = *(undefined8 *)result->val_;
    fVar6 = result->val_[2];
    if ((0.0 < (*(float *)((long)(&pPVar2->point + -1) + lVar5) - fVar6) *
               *(float *)((long)(pPVar2->point).val_ + lVar5) +
               (*(float *)((long)(pPVar2->point).val_ + lVar5 + -0x14) - (float)uVar1) *
               *(float *)((long)(pPVar2->point).val_ + lVar5 + -8) +
               (*(float *)((long)(pPVar2->point).val_ + lVar5 + -0x10) -
               (float)((ulong)uVar1 >> 0x20)) * *(float *)((long)(pPVar2->point).val_ + lVar5 + -4))
       && (bVar3 = linearProgram2(planes,planeNo,radius,optVelocity,directionOpt,result), !bVar3))
    break;
    planeNo = planeNo + 1;
    lVar5 = lVar5 + 0x18;
  }
  *(undefined8 *)result->val_ = uVar1;
  result->val_[2] = fVar6;
  return planeNo;
}

Assistant:

size_t linearProgram3(const std::vector<Plane> &planes, float radius, const Vector3 &optVelocity, bool directionOpt, Vector3 &result)
	{
		if (directionOpt) {
			/* Optimize direction. Note that the optimization velocity is of unit length in this case. */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector3 tempResult = result;

				if (!linearProgram2(planes, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return planes.size();
	}